

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclableObject.cpp
# Opt level: O1

Var __thiscall Js::RecyclableObject::GetHostDispatchVar(RecyclableObject *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar3 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/RecyclableObject.cpp"
                              ,0x332,"(0)","FALSE");
  if (bVar2) {
    *puVar3 = 0;
    return (((((this->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           undefinedValue.ptr;
  }
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

Var RecyclableObject::GetHostDispatchVar()
    {
        Assert(FALSE);
        return this->GetLibrary()->GetUndefined();
    }